

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O0

FVoxel * R_LoadKVX(int lumpnum)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  size_t sVar4;
  DWORD *foo;
  ulong uVar5;
  int *piVar6;
  BYTE *pBVar7;
  long lVar8;
  TVector3<double> local_d0;
  undefined4 local_b4;
  int local_b0;
  int local_ac;
  int yoff;
  int xoff;
  int voxdatasize;
  int offsetsize;
  FVoxelMipLevel *mipl;
  int numbytes;
  int voxelsize;
  BYTE *rawvoxel;
  FMemLump lump;
  int local_78;
  int n;
  int j;
  int i;
  int maxmipsize;
  int mip;
  BYTE *rawmip;
  FVoxel *voxel;
  kvxslab_t *slabs [5];
  FVoxel *pFStack_10;
  int lumpnum_local;
  
  pFStack_10 = (FVoxel *)operator_new(0x158);
  FVoxel::FVoxel(pFStack_10);
  FWadCollection::ReadLump((FWadCollection *)&rawvoxel,0x1f756a0);
  _numbytes = (DWORD *)FMemLump::GetMem((FMemLump *)&rawvoxel);
  sVar4 = FMemLump::GetSize((FMemLump *)&rawvoxel);
  mipl._4_4_ = (int)sVar4 + -1;
  i = 0;
  _maxmipsize = _numbytes;
  j = (int)sVar4 + -0x305;
  do {
    foo = _maxmipsize;
    if (((4 < i) || (mipl._0_4_ = GetInt((uchar *)_maxmipsize), j < (int)mipl)) ||
       ((int)mipl < 0x18)) break;
    foo = _maxmipsize + 1;
    _voxdatasize = pFStack_10->Mips + i;
    iVar3 = GetInt((uchar *)foo);
    _voxdatasize->SizeX = iVar3;
    iVar3 = GetInt((uchar *)(_maxmipsize + 2));
    _voxdatasize->SizeY = iVar3;
    iVar3 = GetInt((uchar *)(_maxmipsize + 3));
    _voxdatasize->SizeZ = iVar3;
    iVar3 = GetInt((uchar *)(_maxmipsize + 4));
    (_voxdatasize->Pivot).X = (double)iVar3 * 0.00390625;
    iVar3 = GetInt((uchar *)(_maxmipsize + 5));
    (_voxdatasize->Pivot).Y = (double)iVar3 * 0.00390625;
    iVar3 = GetInt((uchar *)(_maxmipsize + 6));
    (_voxdatasize->Pivot).Z = (double)iVar3 / 256.0;
    xoff = (_voxdatasize->SizeX + 1) * 4 + _voxdatasize->SizeX * (_voxdatasize->SizeY + 1) * 2;
    yoff = ((int)mipl + -0x18) - xoff;
    if (yoff < 0) break;
    if (yoff != 0) {
      iVar3 = (int)mipl + -0x15;
      if ((int)mipl + -0x15 < 0) {
        iVar3 = (int)mipl + -0x12;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(iVar3 >> 2);
      uVar5 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      piVar6 = (int *)operator_new__(uVar5);
      _voxdatasize->OffsetX = piVar6;
      _voxdatasize->OffsetXY = (short *)(_voxdatasize->OffsetX + (long)_voxdatasize->SizeX + 1);
      _voxdatasize->SlabData =
           (BYTE *)(_voxdatasize->OffsetXY + _voxdatasize->SizeX * (_voxdatasize->SizeY + 1));
      n = 0;
      lump.Block.Chars._4_4_ = _voxdatasize->SizeX;
      for (; n <= lump.Block.Chars._4_4_; n = n + 1) {
        iVar3 = GetInt((uchar *)((long)_maxmipsize + (long)(n << 2) + 0x1c));
        _voxdatasize->OffsetX[n] = iVar3 - xoff;
      }
      if ((*_voxdatasize->OffsetX != 0) || (_voxdatasize->OffsetX[_voxdatasize->SizeX] != yoff))
      break;
      local_78 = 0;
      lump.Block.Chars._4_4_ = (_voxdatasize->SizeY + 1) * lump.Block.Chars._4_4_;
      for (; local_78 < lump.Block.Chars._4_4_; local_78 = local_78 + 1) {
        iVar3 = GetShort((uchar *)((long)foo + (long)(local_78 * 2) + (long)(n * 4 + 0x18)));
        _voxdatasize->OffsetXY[local_78] = (short)iVar3;
      }
      for (n = 0; n < _voxdatasize->SizeX; n = n + 1) {
        local_ac = _voxdatasize->OffsetX[n];
        for (local_78 = 0; local_78 < _voxdatasize->SizeY; local_78 = local_78 + 1) {
          local_b0 = (int)_voxdatasize->OffsetXY[(_voxdatasize->SizeY + 1) * n + local_78];
          if ((uint)yoff < (uint)(local_ac + local_b0)) {
            if (pFStack_10 != (FVoxel *)0x0) {
              FVoxel::~FVoxel(pFStack_10);
              operator_delete(pFStack_10,0x158);
            }
            pFStack_10 = (FVoxel *)0x0;
            goto LAB_0074825b;
          }
        }
      }
      slabs[(long)i + -1] = (kvxslab_t *)((long)_maxmipsize + (long)xoff + 0x1c);
    }
    _maxmipsize = (DWORD *)((long)foo + (long)(int)mipl);
    j = j - ((int)mipl + 4);
    i = i + 1;
  } while( true );
  _maxmipsize = foo;
  if ((i == 0) || (_maxmipsize != (DWORD *)((long)_numbytes + (long)mipl._4_4_ + -0x300))) {
    if (pFStack_10 != (FVoxel *)0x0) {
      FVoxel::~FVoxel(pFStack_10);
      operator_delete(pFStack_10,0x158);
    }
    pFStack_10 = (FVoxel *)0x0;
  }
  else {
    while ((0 < i && (pFStack_10->Mips[i + -1].SlabData == (BYTE *)0x0))) {
      i = i + -1;
    }
    pFStack_10->NumMips = i;
    for (n = 1; n < i; n = n + 1) {
      TVector3<double>::operator/(&local_d0,&pFStack_10->Mips[n + -1].Pivot,2.0);
      TVector3<double>::operator=(&pFStack_10->Mips[n].Pivot,&local_d0);
    }
    for (n = 0; n < i; n = n + 1) {
      lVar8 = (long)n;
      bVar2 = CopyVoxelSlabs((kvxslab_t *)pFStack_10->Mips[lVar8].SlabData,slabs[lVar8 + -1],
                             pFStack_10->Mips[lVar8].OffsetX[pFStack_10->Mips[lVar8].SizeX]);
      if (!bVar2) {
        if (pFStack_10 != (FVoxel *)0x0) {
          FVoxel::~FVoxel(pFStack_10);
          operator_delete(pFStack_10,0x158);
        }
        pFStack_10 = (FVoxel *)0x0;
        goto LAB_0074825b;
      }
    }
    pFStack_10->LumpNum = lumpnum;
    pBVar7 = (BYTE *)operator_new__(0x300);
    pFStack_10->Palette = pBVar7;
    memcpy(pFStack_10->Palette,(uchar *)((long)_numbytes + (long)mipl._4_4_ + -0x300),0x300);
  }
LAB_0074825b:
  local_b4 = 1;
  FMemLump::~FMemLump((FMemLump *)&rawvoxel);
  return pFStack_10;
}

Assistant:

FVoxel *R_LoadKVX(int lumpnum)
{
	const kvxslab_t *slabs[MAXVOXMIPS];
	FVoxel *voxel = new FVoxel;
	const BYTE *rawmip;
	int mip, maxmipsize;
	int i, j, n;

	FMemLump lump = Wads.ReadLump(lumpnum);	// FMemLump adds an extra 0 byte to the end.
	BYTE *rawvoxel = (BYTE *)lump.GetMem();
	int voxelsize = (int)(lump.GetSize()-1);

	// Oh, KVX, why couldn't you have a proper header? We'll just go through
	// and collect each MIP level, doing lots of range checking, and if the
	// last one doesn't end exactly 768 bytes before the end of the file,
	// we'll reject it.

	for (mip = 0, rawmip = rawvoxel, maxmipsize = voxelsize - 768 - 4;
		 mip < MAXVOXMIPS;
		 mip++)
	{
		int numbytes = GetInt(rawmip);
		if (numbytes > maxmipsize || numbytes < 24)
		{
			break;
		}
		rawmip += 4;

		FVoxelMipLevel *mipl = &voxel->Mips[mip];

		// Load header data.
		mipl->SizeX = GetInt(rawmip + 0);
		mipl->SizeY = GetInt(rawmip + 4);
		mipl->SizeZ = GetInt(rawmip + 8);
		mipl->Pivot.X = GetInt(rawmip + 12) / 256.;
		mipl->Pivot.Y = GetInt(rawmip + 16) / 256.;
		mipl->Pivot.Z = GetInt(rawmip + 20) / 256.;

		// How much space do we have for voxdata?
		int offsetsize = (mipl->SizeX + 1) * 4 + mipl->SizeX * (mipl->SizeY + 1) * 2;
		int voxdatasize = numbytes - 24 - offsetsize;
		if (voxdatasize < 0)
		{ // Clearly, not enough.
			break;
		}
		if (voxdatasize != 0)
		{	// This mip level is not empty.
			// Allocate slab data space.
			mipl->OffsetX = new int[(numbytes - 24 + 3) / 4];
			mipl->OffsetXY = (short *)(mipl->OffsetX + mipl->SizeX + 1);
			mipl->SlabData = (BYTE *)(mipl->OffsetXY + mipl->SizeX * (mipl->SizeY + 1));

			// Load x offsets.
			for (i = 0, n = mipl->SizeX; i <= n; ++i)
			{
				// The X offsets stored in the KVX file are relative to the start of the
				// X offsets array. Make them relative to voxdata instead.
				mipl->OffsetX[i] = GetInt(rawmip + 24 + i * 4) - offsetsize;
			}

			// The first X offset must be 0 (since we subtracted offsetsize), according to the spec:
			//		NOTE: xoffset[0] = (xsiz+1)*4 + xsiz*(ysiz+1)*2 (ALWAYS)
			if (mipl->OffsetX[0] != 0)
			{
				break;
			}
			// And the final X offset must point just past the end of the voxdata.
			if (mipl->OffsetX[mipl->SizeX] != voxdatasize)
			{
				break;
			}

			// Load xy offsets.
			i = 24 + i * 4;
			for (j = 0, n *= mipl->SizeY + 1; j < n; ++j)
			{
				mipl->OffsetXY[j] = GetShort(rawmip + i + j * 2);
			}

			// Ensure all offsets are within bounds.
			for (i = 0; i < mipl->SizeX; ++i)
			{
				int xoff = mipl->OffsetX[i];
				for (j = 0; j < mipl->SizeY; ++j)
				{
					int yoff = mipl->OffsetXY[(mipl->SizeY + 1) * i + j];
					if (unsigned(xoff + yoff) > unsigned(voxdatasize))
					{
						delete voxel;
						return NULL;
					}
				}
			}

			// Record slab location for the end.
			slabs[mip] = (kvxslab_t *)(rawmip + 24 + offsetsize);
		}

		// Time for the next mip Level.
		rawmip += numbytes;
		maxmipsize -= numbytes + 4;
	}